

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

int __thiscall QAbstractSpinBoxPrivate::init(QAbstractSpinBoxPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *parent;
  int iVar1;
  QLineEdit *this_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_01;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QStyleOptionSpinBox opt;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(this_00,parent);
  QAbstractSpinBox::setLineEdit((QAbstractSpinBox *)parent,this_00);
  QVar3.m_size = (size_t)"qt_spinbox_lineedit";
  QVar3.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->edit;
  QObject::setObjectName(QVar3);
  this_01.m_data = operator_new(0x20);
  QValidator::QValidator((QValidator *)this_01.m_data_utf8,&parent->super_QObject);
  *(undefined ***)this_01.m_data = &PTR_metaObject_00807ef0;
  *(QWidget **)((long)this_01.m_data + 0x10) = parent;
  *(QAbstractSpinBoxPrivate **)((long)this_01.m_data + 0x18) = this;
  QVar4.m_size = (size_t)"qt_spinboxvalidator";
  QVar4.field_0.m_data = this_01.m_data;
  QObject::setObjectName(QVar4);
  this->validator = (QSpinBoxValidator *)this_01;
  QLineEdit::setValidator(this->edit,(QValidator *)this_01.m_data_utf8);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)local_88);
  (**(code **)(*(long *)parent + 0x1c0))(parent,local_88);
  pQVar2 = QWidget::style(parent);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x2c,local_88,parent,0);
  this->spinClickTimerInterval = iVar1;
  pQVar2 = QWidget::style(parent);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x53,local_88,parent,0);
  this->spinClickThresholdTimerInterval = iVar1;
  QWidget::setFocusPolicy(parent,WheelFocus);
  QWidget::setSizePolicy(parent,(QSizePolicy)0xc010000);
  QWidget::setAttribute(parent,WA_InputMethodEnabled,true);
  QWidget::setAttribute(parent,WA_MacShowFocusRect,true);
  QStyleOption::~QStyleOption((QStyleOption *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::init()
{
    Q_Q(QAbstractSpinBox);

    q->setLineEdit(new QLineEdit(q));
    edit->setObjectName("qt_spinbox_lineedit"_L1);
    validator = new QSpinBoxValidator(q, this);
    edit->setValidator(validator);

    QStyleOptionSpinBox opt;
    // ### This is called from the ctor and thus we shouldn't call initStyleOption yet
    // ### as we only call the base class implementation of initStyleOption called.
    q->initStyleOption(&opt);
    spinClickTimerInterval = q->style()->styleHint(QStyle::SH_SpinBox_ClickAutoRepeatRate, &opt, q);
    spinClickThresholdTimerInterval = q->style()->styleHint(QStyle::SH_SpinBox_ClickAutoRepeatThreshold, &opt, q);
    q->setFocusPolicy(Qt::WheelFocus);
    q->setSizePolicy(QSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed, QSizePolicy::SpinBox));
    q->setAttribute(Qt::WA_InputMethodEnabled);

    q->setAttribute(Qt::WA_MacShowFocusRect);
}